

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::SumState<duckdb::hugeint_t>,int,duckdb::SumToHugeintOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  long *local_70;
  long local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar5 = *(long *)(input + 0x28);
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (lVar5 == 0) {
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
LAB_0041f476:
          uVar13 = uVar9;
          if (uVar9 < uVar6) {
            uVar11 = *(ulong *)(state + 8);
            do {
              iVar1 = *(int *)(lVar4 + uVar9 * 4);
              uVar13 = (ulong)iVar1;
              uVar11 = uVar11 + uVar13;
              if (-1 < (long)uVar13 != uVar13 <= uVar11) {
                *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
            *state = '\x01';
            *(ulong *)(state + 8) = uVar11;
            uVar13 = uVar6;
          }
        }
        else {
          uVar11 = *(ulong *)(lVar5 + uVar10 * 8);
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
          if (uVar11 == 0xffffffffffffffff) goto LAB_0041f476;
          uVar13 = uVar6;
          if ((uVar11 != 0) && (uVar13 = uVar9, uVar9 < uVar6)) {
            uVar12 = 0;
            do {
              if ((uVar11 >> (uVar12 & 0x3f) & 1) != 0) {
                *state = '\x01';
                iVar1 = *(int *)(lVar4 + uVar9 * 4 + uVar12 * 4);
                uVar13 = (ulong)iVar1;
                lVar3 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar3 + uVar13;
                if (-1 < (long)uVar13 != uVar13 <= lVar3 + uVar13) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
                }
              }
              uVar12 = uVar12 + 1;
              uVar13 = uVar6;
            } while (uVar6 - uVar9 != uVar12);
          }
        }
        uVar10 = uVar10 + 1;
        uVar9 = uVar13;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      piVar2 = *(int **)(input + 0x20);
      *state = '\x01';
      AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,int>
                ((SumState<duckdb::hugeint_t> *)state,*piVar2,count);
      return;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_60 == 0) {
      if (count != 0) {
        lVar4 = *local_70;
        uVar9 = *(ulong *)(state + 8);
        iVar7 = 0;
        do {
          iVar8 = iVar7;
          if (lVar4 != 0) {
            iVar8 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
          }
          iVar1 = *(int *)(local_68 + iVar8 * 4);
          uVar10 = (ulong)iVar1;
          uVar9 = uVar9 + uVar10;
          if (-1 < (long)uVar10 != uVar10 <= uVar9) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
        *state = '\x01';
        *(ulong *)(state + 8) = uVar9;
      }
    }
    else if (count != 0) {
      lVar4 = *local_70;
      iVar7 = 0;
      do {
        iVar8 = iVar7;
        if (lVar4 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
        }
        if ((*(ulong *)(local_60 + (iVar8 >> 6) * 8) >> (iVar8 & 0x3f) & 1) != 0) {
          *state = '\x01';
          iVar1 = *(int *)(local_68 + iVar8 * 4);
          uVar9 = (ulong)iVar1;
          lVar5 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar5 + uVar9;
          if (-1 < (long)uVar9 != uVar9 <= lVar5 + uVar9) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}